

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoserver.cpp
# Opt level: O3

void server_pump_queue(void *server_void)

{
  EOClient *pEVar1;
  _Map_pointer ppuVar2;
  _Map_pointer ppuVar3;
  _Elt_pointer puVar4;
  _Elt_pointer puVar5;
  _Elt_pointer puVar6;
  _Elt_pointer puVar7;
  long lVar8;
  bool bVar9;
  PacketFamily family;
  PacketAction action_00;
  int iVar10;
  IPAddress IVar11;
  mapped_type *this;
  ulong uVar12;
  long *plVar13;
  long *plVar14;
  unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_> action;
  key_type local_78;
  EOClient *local_58;
  long *local_50;
  _Head_base<0UL,_ActionQueue_Action_*,_false> local_48;
  double local_40;
  void *local_38;
  
  local_40 = Timer::GetTime();
  plVar14 = (long *)((long)server_void + 0x38);
  plVar13 = *(long **)((long)server_void + 0x38);
  local_50 = plVar14;
  local_38 = server_void;
  if (plVar13 != plVar14) {
    do {
      pEVar1 = (EOClient *)plVar13[2];
      bVar9 = Client::Connected((Client *)pEVar1);
      if (bVar9) {
        ppuVar2 = *(_Map_pointer *)
                   ((long)&(pEVar1->queue).queue.c.
                           super__Deque_base<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish + 0x18);
        ppuVar3 = *(_Map_pointer *)
                   ((long)&(pEVar1->queue).queue.c.
                           super__Deque_base<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_start + 0x18);
        puVar4 = *(_Elt_pointer *)
                  ((long)&(pEVar1->queue).queue.c.
                          super__Deque_base<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start + 0x10);
        puVar5 = (pEVar1->queue).queue.c.
                 super__Deque_base<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        puVar6 = *(_Elt_pointer *)
                  ((long)&(pEVar1->queue).queue.c.
                          super__Deque_base<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish + 8);
        puVar7 = (pEVar1->queue).queue.c.
                 super__Deque_base<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar8 = *(long *)((long)local_38 + 0x90);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        local_58 = pEVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"PacketQueueMax","");
        this = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)(lVar8 + 0x198),&local_78);
        iVar10 = util::variant::GetInt(this);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        plVar14 = local_50;
        pEVar1 = local_58;
        uVar12 = ((long)puVar4 - (long)puVar7 >> 3) + ((long)puVar5 - (long)puVar6 >> 3) +
                 ((((ulong)((long)ppuVar2 - (long)ppuVar3) >> 3) - 1) +
                 (ulong)(ppuVar2 == (_Map_pointer)0x0)) * 0x40;
        if ((ulong)(long)iVar10 < uVar12) {
          IVar11 = Client::GetRemoteAddr(&local_58->super_Client);
          local_48._M_head_impl._0_4_ = IVar11.address;
          IPAddress::operator_cast_to_string(&local_78,(IPAddress *)&local_48);
          Console::Wrn("Client was disconnected for filling up the action queue: %s");
          plVar14 = local_50;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          Client::Close(&pEVar1->super_Client,false);
        }
        else if ((uVar12 != 0) && ((local_58->queue).next <= local_40)) {
          puVar4 = (local_58->queue).queue.c.
                   super__Deque_base<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_48._M_head_impl =
               (puVar4->_M_t).
               super___uniq_ptr_impl<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>.
               _M_t.
               super__Tuple_impl<0UL,_ActionQueue_Action_*,_std::default_delete<ActionQueue_Action>_>
               .super__Head_base<0UL,_ActionQueue_Action_*,_false>._M_head_impl;
          (puVar4->_M_t).
          super___uniq_ptr_impl<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>._M_t.
          super__Tuple_impl<0UL,_ActionQueue_Action_*,_std::default_delete<ActionQueue_Action>_>.
          super__Head_base<0UL,_ActionQueue_Action_*,_false>._M_head_impl =
               (ActionQueue_Action *)0x0;
          std::
          deque<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
          ::pop_front((deque<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
                       *)&local_58->queue);
          family = PacketReader::Family(&(local_48._M_head_impl)->reader);
          action_00 = PacketReader::Action(&(local_48._M_head_impl)->reader);
          Handlers::packet_handler_register::Handle
                    (Handlers::packet_handler_register_instance,family,action_00,local_58,
                     &(local_48._M_head_impl)->reader,
                     (bool)((local_48._M_head_impl)->auto_queue ^ 1));
          (local_58->queue).next = (local_48._M_head_impl)->time + local_40;
          std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>::~unique_ptr
                    ((unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_> *)
                     &local_48);
        }
      }
      plVar13 = (long *)*plVar13;
    } while (plVar13 != plVar14);
  }
  return;
}

Assistant:

void server_pump_queue(void *server_void)
{
	EOServer *server = static_cast<EOServer *>(server_void);
	double now = Timer::GetTime();

	UTIL_FOREACH(server->clients, rawclient)
	{
		EOClient *client = static_cast<EOClient *>(rawclient);

		if (!client->Connected())
			continue;

		std::size_t size = client->queue.queue.size();

		if (size > std::size_t(int(server->world->config["PacketQueueMax"])))
		{
			Console::Wrn("Client was disconnected for filling up the action queue: %s", static_cast<std::string>(client->GetRemoteAddr()).c_str());
			client->Close();
			continue;
		}

		if (size != 0 && client->queue.next <= now)
		{
			std::unique_ptr<ActionQueue_Action> action = std::move(client->queue.queue.front());
			client->queue.queue.pop();

#ifndef DEBUG_EXCEPTIONS
			try
			{
#endif // DEBUG_EXCEPTIONS
				Handlers::Handle(action->reader.Family(), action->reader.Action(), client, action->reader, !action->auto_queue);
#ifndef DEBUG_EXCEPTIONS
			}
			catch (Socket_Exception& e)
			{
				Console::Err("Client caused an exception and was closed: %s.", static_cast<std::string>(client->GetRemoteAddr()).c_str());
				Console::Err("%s: %s", e.what(), e.error());
				client->Close();
			}
			catch (Database_Exception& e)
			{
				Console::Err("Client caused an exception and was closed: %s.", static_cast<std::string>(client->GetRemoteAddr()).c_str());
				Console::Err("%s: %s", e.what(), e.error());
				client->Close();
			}
			catch (std::runtime_error& e)
			{
				Console::Err("Client caused an exception and was closed: %s.", static_cast<std::string>(client->GetRemoteAddr()).c_str());
				Console::Err("Runtime Error: %s", e.what());
				client->Close();
			}
			catch (std::logic_error& e)
			{
				Console::Err("Client caused an exception and was closed: %s.", static_cast<std::string>(client->GetRemoteAddr()).c_str());
				Console::Err("Logic Error: %s", e.what());
				client->Close();
			}
			catch (std::exception& e)
			{
				Console::Err("Client caused an exception and was closed: %s.", static_cast<std::string>(client->GetRemoteAddr()).c_str());
				Console::Err("Uncaught Exception: %s", e.what());
				client->Close();
			}
			catch (...)
			{
				Console::Err("Client caused an exception and was closed: %s.", static_cast<std::string>(client->GetRemoteAddr()).c_str());
				client->Close();
			}
#endif // DEBUG_EXCEPTIONS

			client->queue.next = now + action->time;
		}
	}
}